

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O1

int bio_socket_nbio(int sock,int on)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0;
  uVar1 = fcntl(sock,3,0);
  if (-1 < (int)uVar1) {
    uVar2 = uVar1 & 0x7ffff7ff;
    if (on != 0) {
      uVar2 = uVar1 | 0x800;
    }
    iVar3 = fcntl(sock,4,(ulong)uVar2);
    uVar2 = (uint)(iVar3 == 0);
  }
  return uVar2;
}

Assistant:

int bio_socket_nbio(int sock, int on) {
#if defined(OPENSSL_WINDOWS)
  u_long arg = on;

  return 0 == ioctlsocket(sock, FIONBIO, &arg);
#else
  int flags = fcntl(sock, F_GETFL, 0);
  if (flags < 0) {
    return 0;
  }
  if (!on) {
    flags &= ~O_NONBLOCK;
  } else {
    flags |= O_NONBLOCK;
  }
  return fcntl(sock, F_SETFL, flags) == 0;
#endif
}